

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::PrinterTest_AnnotateIndentNewline_Test::TestBody
          (PrinterTest_AnnotateIndentNewline_Test *this)

{
  initializer_list<int> __l;
  bool bVar1;
  ZeroCopyOutputStream *output;
  char *pcVar2;
  Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record> *matchers;
  ElementsAreMatcher<std::tuple<testing::Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>_>_>
  *matcher;
  _Head_base<0UL,_int,_false> path;
  FakeDescriptor *descriptor_00;
  undefined4 uVar3;
  optional<google::protobuf::io::AnnotationCollector::Semantic> semantic;
  AssertHelper local_2e0;
  Message local_2d8;
  Span<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record> local_2d0
  ;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> local_2bc;
  int local_2b4;
  _Storage<google::protobuf::io::AnnotationCollector::Semantic,_true> local_2b0 [2];
  Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record> local_2a8;
  ElementsAreMatcher<std::tuple<testing::Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>_>_>
  local_290;
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<testing::Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>_>_>_>
  local_278;
  undefined1 local_260 [8];
  AssertionResult gtest_ar_1;
  Message local_248;
  string_view local_240;
  undefined1 local_230 [8];
  AssertionResult gtest_ar;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_208;
  string_view local_200;
  string_view local_1f0;
  undefined1 local_1de;
  allocator<int> local_1dd;
  int local_1dc;
  iterator local_1d8;
  size_type local_1d0;
  allocator<char> local_1c1;
  undefined1 local_1c0 [8];
  FakeDescriptor descriptor;
  undefined1 local_168 [8];
  Printer printer;
  AnnotationCollector local_30;
  FakeAnnotationCollector_conflict collector;
  PrinterTest_AnnotateIndentNewline_Test *this_local;
  
  collector.annotations_.
  super__Vector_base<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record,_std::allocator<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  FakeAnnotationCollector::FakeAnnotationCollector((FakeAnnotationCollector *)&local_30);
  output = PrinterTest::output(&this->super_PrinterTest);
  Printer::Printer((Printer *)local_168,output,'$',&local_30);
  Printer::Indent((Printer *)local_168);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             &descriptor.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,"$A$$N$$B$C\n");
  Printer::Print<char[2],char[1],char[2],char[3],char[2],char[1]>
            ((Printer *)local_168,stack0xfffffffffffffe78,(char (*) [2])0x1e0aa04,
             (char (*) [1])(anon_var_dwarf_37cdd0 + 5),(char (*) [2])0x212d87a,(char (*) [3])"\nz",
             (char (*) [2])0x212f67e,(char (*) [1])(anon_var_dwarf_37cdd0 + 5));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1c0,"path",&local_1c1);
  local_1de = 1;
  local_1dc = 0;
  local_1d8 = &local_1dc;
  local_1d0 = 1;
  std::allocator<int>::allocator(&local_1dd);
  __l._M_len = local_1d0;
  __l._M_array = local_1d8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)((long)&descriptor.fake_file.filename.field_2 + 8)
             ,__l,&local_1dd);
  local_1de = 0;
  std::allocator<int>::~allocator(&local_1dd);
  std::allocator<char>::~allocator(&local_1c1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1f0,"A");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_200,"B");
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_208);
  descriptor_00 = (FakeDescriptor *)local_1c0;
  Printer::Annotate<google::protobuf::io::(anonymous_namespace)::FakeDescriptor>
            ((Printer *)local_168,local_1f0,local_200,descriptor_00,local_208);
  uVar3 = local_208.
          super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>.
          _M_payload.
          super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>._4_4_;
  path._M_head_impl = (int)descriptor_00;
  Printer::Outdent((Printer *)local_168);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar.message_,"\n");
  Printer::Print<>((Printer *)local_168,stack0xfffffffffffffde0);
  FakeDescriptor::~FakeDescriptor((FakeDescriptor *)local_1c0);
  Printer::~Printer((Printer *)local_168);
  local_240 = PrinterTest::written(&this->super_PrinterTest);
  testing::internal::EqHelper::
  Compare<std::basic_string_view<char,_std::char_traits<char>_>,_char[8],_nullptr>
            ((EqHelper *)local_230,"written()","\"\\nz  C\\n\\n\"",&local_240,
             (char (*) [8])"\nz  C\n\n");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    testing::Message::Message(&local_248);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_230);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer_unittest.cc"
               ,0x160,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  local_2b4 = 0;
  testing::ElementsAre<int>((testing *)local_2b0,&local_2b4);
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional
            ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&local_2bc);
  semantic.super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>.
  _M_payload.super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>._4_4_
       = uVar3;
  semantic.super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>.
  _M_payload.super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>.
  _M_payload._M_value = local_2b0[0]._M_value;
  io::(anonymous_namespace)::
  Annotation<int,int,char_const*,testing::internal::ElementsAreMatcher<std::tuple<int>>,std::optional<google::protobuf::io::AnnotationCollector::Semantic>>
            (&local_2a8,(_anonymous_namespace_ *)0x0,4,0x1e5cf74,(char *)local_2bc,
             (ElementsAreMatcher<std::tuple<int>_>)path._M_head_impl,semantic);
  testing::
  ElementsAre<testing::Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>>
            (&local_290,(testing *)&local_2a8,matchers);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<testing::Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>>>>
            (&local_278,(internal *)&local_290,matcher);
  local_2d0 = FakeAnnotationCollector::Get((FakeAnnotationCollector *)&local_30);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<testing::Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>>>>
  ::operator()(local_260,(char *)&local_278,
               (Span<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>
                *)"collector.Get()");
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<testing::Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>_>_>_>
  ::~PredicateFormatterFromMatcher(&local_278);
  testing::internal::
  ElementsAreMatcher<std::tuple<testing::Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>_>_>
  ::~ElementsAreMatcher(&local_290);
  testing::Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>::
  ~Matcher(&local_2a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar1) {
    testing::Message::Message(&local_2d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer_unittest.cc"
               ,0x163,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2e0,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2e0);
    testing::Message::~Message(&local_2d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  FakeAnnotationCollector::~FakeAnnotationCollector((FakeAnnotationCollector *)&local_30);
  return;
}

Assistant:

TEST_F(PrinterTest, AnnotateIndentNewline) {
  FakeAnnotationCollector collector;
  {
    Printer printer(output(), '$', &collector);
    printer.Indent();

    printer.Print("$A$$N$$B$C\n", "A", "", "N", "\nz", "B", "");
    FakeDescriptor descriptor{{"path"}, {0}};
    printer.Annotate("A", "B", &descriptor);

    printer.Outdent();
    printer.Print("\n");
  }
  EXPECT_EQ(written(), "\nz  C\n\n");

  EXPECT_THAT(collector.Get(),
              ElementsAre(Annotation(0, 4, "path", ElementsAre(0))));
}